

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  int offset_local;
  
  pIVar2 = GImGui;
  if (-2 < offset) {
    ppIVar1 = &GImGui->CurrentWindow;
    GImGui->FocusRequestNextWindow = *ppIVar1;
    pIVar2->FocusRequestNextCounterRegular = ((*ppIVar1)->DC).FocusCounterRegular + 1 + offset;
    pIVar2->FocusRequestNextCounterTabStop = 0x7fffffff;
    return;
  }
  __assert_fail("offset >= -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                ,0x1a2e,"void ImGui::SetKeyboardFocusHere(int)");
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    g.FocusRequestNextWindow = window;
    g.FocusRequestNextCounterRegular = window->DC.FocusCounterRegular + 1 + offset;
    g.FocusRequestNextCounterTabStop = INT_MAX;
}